

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

bool __thiscall testing::internal::MatchMatrix::NextGraph(MatchMatrix *this)

{
  size_t sVar1;
  reference pvVar2;
  MatchMatrix *in_RDI;
  char *b;
  size_t irhs;
  size_t ilhs;
  ulong local_20;
  ulong local_18;
  
  local_18 = 0;
  do {
    sVar1 = LhsSize(in_RDI);
    if (sVar1 <= local_18) {
      return false;
    }
    for (local_20 = 0; sVar1 = RhsSize(in_RDI), local_20 < sVar1; local_20 = local_20 + 1) {
      sVar1 = SpaceIndex(in_RDI,local_18,local_20);
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x10),sVar1);
      if (*pvVar2 == '\0') {
        *pvVar2 = '\x01';
        return true;
      }
      *pvVar2 = '\0';
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

bool MatchMatrix::NextGraph() {
  for (size_t ilhs = 0; ilhs < LhsSize(); ++ilhs) {
    for (size_t irhs = 0; irhs < RhsSize(); ++irhs) {
      char& b = matched_[SpaceIndex(ilhs, irhs)];
      if (!b) {
        b = 1;
        return true;
      }
      b = 0;
    }
  }
  return false;
}